

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O2

void __thiscall
minibag::Bag::readHeaderFromBuffer
          (Bag *this,Buffer *buffer,uint32_t offset,Header *header,uint32_t *data_size,
          uint32_t *bytes_read)

{
  uint uVar1;
  char cVar2;
  uint8_t *puVar3;
  BagFormatException *this_00;
  uint uVar4;
  allocator<char> local_79;
  uint32_t *local_78;
  string error_msg;
  string local_50;
  
  local_78 = bytes_read;
  puVar3 = Buffer::getData(buffer);
  uVar4 = (int)(puVar3 + offset) + 4;
  uVar1 = *(uint *)(puVar3 + offset);
  error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
  error_msg._M_string_length = 0;
  error_msg.field_2._M_local_buf[0] = '\0';
  cVar2 = miniros::Header::parse((uchar *)header,uVar4,(string *)(ulong)uVar1);
  if (cVar2 != '\0') {
    *data_size = *(uint32_t *)(puVar3 + offset + 4 + (long)(ulong)uVar1);
    *local_78 = ((uVar4 + uVar1) - (int)(puVar3 + offset)) + 4;
    std::__cxx11::string::~string((string *)&error_msg);
    return;
  }
  this_00 = (BagFormatException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Error parsing header",&local_79);
  BagFormatException::BagFormatException(this_00,&local_50);
  __cxa_throw(this_00,&BagFormatException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Bag::readHeaderFromBuffer(Buffer& buffer, uint32_t offset, miniros::Header& header, uint32_t& data_size, uint32_t& bytes_read) const {
    assert(buffer.getSize() > 8);

    uint8_t* start = (uint8_t*) buffer.getData() + offset;

    uint8_t* ptr = start;

    // Read the header length
    uint32_t header_len;
    memcpy(&header_len, ptr, 4);
    ptr += 4;

    // Parse the header
    string error_msg;
    bool parsed = header.parse(ptr, header_len, error_msg);
    if (!parsed)
        throw BagFormatException("Error parsing header");
    ptr += header_len;

    // Read the data size
    memcpy(&data_size, ptr, 4);
    ptr += 4;

    bytes_read = ptr - start;
}